

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

bool google::FindSymbol(uint64_t pc,int fd,char *out,int out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  ssize_t sVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  byte bVar15;
  Elf64_Sym buf [32];
  undefined1 local_338 [16];
  long local_328 [95];
  
  if (symtab == (Elf64_Shdr *)0x0) {
    bVar13 = false;
  }
  else {
    iVar14 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = symtab->sh_entsize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = symtab->sh_size;
    bVar15 = SUB161(auVar2 / auVar1,0);
    iVar11 = SUB164(auVar2 / auVar1,0);
    if (0 < iVar11) {
      do {
        iVar9 = iVar11 - iVar14;
        if (0x1f < iVar9) {
          iVar9 = 0x20;
        }
        uVar4 = ReadFromOffset(fd,local_338,(long)iVar9 * 0x18,
                               symtab->sh_entsize * (long)iVar14 + symtab->sh_offset);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar4;
        uVar5 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),0);
        if ((0xaaaaaaaaaaaaaaa < (uVar5 >> 3 | uVar5 << 0x3d)) ||
           (uVar5 = uVar4 / 0x18, (long)iVar9 < (long)uVar5)) {
          abort();
        }
        plVar6 = local_328;
        uVar10 = uVar5;
        if (0x17 < uVar4) {
          do {
            if ((((plVar6[-1] != 0) && (uVar4 = plVar6[-1] + symbol_offset, uVar4 <= pc)) &&
                (*(short *)((long)plVar6 + -10) != 0)) && (pc < uVar4 + *plVar6)) {
              sVar7 = ReadFromOffset(fd,out,(long)out_size,
                                     (ulong)*(uint *)(plVar6 + -2) + strtab->sh_offset);
              if (sVar7 < 1) {
                bVar15 = false;
              }
              else {
                pvVar8 = memchr(out,0,(long)out_size);
                bVar15 = pvVar8 != (void *)0x0;
              }
              bVar12 = 1;
              goto LAB_00117bd3;
            }
            plVar6 = plVar6 + 3;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        bVar15 = (byte)plVar6;
        iVar14 = iVar14 + (int)uVar5;
      } while (iVar14 < iVar11);
    }
    bVar12 = 0;
LAB_00117bd3:
    bVar13 = (bool)(bVar12 & bVar15);
  }
  return bVar13;
}

Assistant:

static ATTRIBUTE_NOINLINE bool
FindSymbol(uint64_t pc, const int fd, char *out, int out_size,
           uint64_t symbol_offset, const ElfW(Shdr) *strtab,
           const ElfW(Shdr) *symtab) {
  if (symtab == NULL) {
    return false;
  }
  const int num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (int i = 0; i < num_symbols;) {
    off_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#if __WORDSIZE == 64
#define NUM_SYMBOLS 32
#else
#define NUM_SYMBOLS 64
#endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    int num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_symbols_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (int j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == NULL) {
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}